

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionZ.cpp
# Opt level: O3

void __thiscall OpenMD::PositionZ::process(PositionZ *this)

{
  SelectionManager *this_00;
  long *plVar1;
  double dVar2;
  undefined8 uVar3;
  char cVar4;
  SimInfo *info;
  Snapshot *pSVar5;
  iterator __position;
  pointer pdVar6;
  int iVar7;
  int iVar8;
  StuntDouble *pSVar9;
  SelectionSet *pSVar10;
  mapped_type_conflict *pmVar11;
  uint i;
  double *pdVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  int binNo;
  int ii;
  Vector3d pos;
  Mat3x3d hmat;
  DumpReader reader;
  int local_1330;
  int local_132c;
  undefined1 local_1328 [8];
  pointer pOStack_1320;
  _Base_ptr local_1318;
  _Base_ptr local_1310;
  _Base_ptr local_1308;
  size_t local_1300;
  vector<double,std::allocator<double>> *local_12f8;
  SelectionEvaluator *local_12f0;
  double local_12e8 [3];
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  cVar4 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar7 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar7 / (this->super_StaticAnalyser).step_;
  if (0 < iVar7) {
    local_12f8 = (vector<double,std::allocator<double>> *)&this->zBox_;
    local_12f0 = &this->evaluator_;
    this_00 = &this->seleMan_;
    iVar14 = 0;
    do {
      DumpReader::readFrame(&local_1288,iVar14);
      pSVar5 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      this->currentSnapshot_ = pSVar5;
      Snapshot::getHmat(&local_12d0,pSVar5);
      pdVar12 = (double *)
                ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_ + (ulong)(uint)this->axis_ * 0x20);
      __position._M_current =
           (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_12f8,__position,pdVar12);
        uVar3 = *(undefined8 *)
                 ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_ + (ulong)(uint)this->axis_ * 0x20);
        uVar16 = (undefined4)uVar3;
        uVar17 = (undefined4)((ulong)uVar3 >> 0x20);
      }
      else {
        dVar2 = *pdVar12;
        uVar16 = SUB84(dVar2,0);
        uVar17 = (undefined4)((ulong)dVar2 >> 0x20);
        *__position._M_current = dVar2;
        (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate((SelectionSet *)local_1328,local_12f0);
        lVar13 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar13),(vector<bool,_std::allocator<bool>_> *)
                             ((long)&(((vector<bool,_std::allocator<bool>_> *)local_1328)->
                                     super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + lVar13));
          lVar13 = lVar13 + 0x28;
        } while (lVar13 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1328
                  );
      }
      pSVar9 = SelectionManager::beginSelected(this_00,&local_132c);
      while (pSVar9 != (StuntDouble *)0x0) {
        pSVar10 = (SelectionSet *)
                  ((long)pSVar9->localIndex_ * 0x18 +
                  *(long *)((long)&(pSVar9->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar9->storage_));
        local_1328 = (undefined1  [8])0x0;
        pOStack_1320 = (pointer)0x0;
        local_1318 = (_Base_ptr)0x0;
        if (pSVar10 != (SelectionSet *)local_1328) {
          lVar13 = 0;
          do {
            *(pointer *)(local_1328 + lVar13 * 8) =
                 (&(pSVar10->bitsets_).
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
        }
        if (cVar4 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)local_1328);
        }
        pSVar10 = (SelectionSet *)
                  ((long)pSVar9->localIndex_ * 0x18 +
                  *(long *)((long)&(pSVar9->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar9->storage_));
        if (pSVar10 != (SelectionSet *)local_1328) {
          lVar13 = 0;
          do {
            (&(pSVar10->bitsets_).
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar13] =
                 *(pointer *)(local_1328 + lVar13 * 8);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
        }
        pSVar9 = SelectionManager::nextSelected(this_00,&local_132c);
      }
      pSVar9 = SelectionManager::beginSelected(this_00,&local_132c);
      while (pSVar9 != (StuntDouble *)0x0) {
        lVar13 = *(long *)((long)&(pSVar9->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar9->storage_);
        local_1318 = *(_Base_ptr *)(lVar13 + 0x10 + (long)pSVar9->localIndex_ * 0x18);
        plVar1 = (long *)(lVar13 + (long)pSVar9->localIndex_ * 0x18);
        local_1328 = (undefined1  [8])*plVar1;
        pOStack_1320 = (pointer)plVar1[1];
        iVar8 = (int)(((*(double *)(local_1328 + (ulong)(uint)this->axis_ * 8) +
                       (double)CONCAT44(uVar17,uVar16) * 0.5) *
                      (double)(this->super_StaticAnalyser).nBins_) /
                     *(double *)
                      ((long)local_12d0.super_SquareMatrix<double,_3>.
                             super_RectMatrix<double,_3U,_3U>.data_ +
                      (ulong)(uint)this->axis_ * 0x20));
        pdVar6 = (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6[iVar8] = pdVar6[iVar8] + 1.0;
        pSVar9 = SelectionManager::nextSelected(this_00,&local_132c);
      }
      iVar14 = iVar14 + (this->super_StaticAnalyser).step_;
    } while (iVar14 < iVar7);
    if (0 < iVar7) {
      iVar14 = 0;
      do {
        pOStack_1320 = (pointer)((ulong)pOStack_1320 & 0xffffffff00000000);
        local_1318 = (_Base_ptr)0x0;
        local_1310 = (_Base_ptr)&pOStack_1320;
        local_1300 = 0;
        local_1308 = local_1310;
        DumpReader::readFrame(&local_1288,iVar14);
        pSVar5 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
        this->currentSnapshot_ = pSVar5;
        Snapshot::getHmat(&local_12d0,pSVar5);
        dVar2 = *(double *)
                 ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_ + (ulong)(uint)this->axis_ * 0x20);
        pSVar9 = SelectionManager::beginSelected(this_00,&local_132c);
        while (pSVar9 != (StuntDouble *)0x0) {
          lVar13 = *(long *)((long)&(pSVar9->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar9->storage_);
          local_12e8[2] = (double)*(undefined8 *)(lVar13 + 0x10 + (long)pSVar9->localIndex_ * 0x18);
          pdVar12 = (double *)(lVar13 + (long)pSVar9->localIndex_ * 0x18);
          local_12e8[0] = *pdVar12;
          local_12e8[1] = pdVar12[1];
          local_1330 = (int)(((local_12e8[(uint)this->axis_] + dVar2 * 0.5) *
                             (double)(this->super_StaticAnalyser).nBins_) /
                            *(double *)
                             ((long)local_12d0.super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_ +
                             (ulong)(uint)this->axis_ * 0x20));
          pmVar11 = std::
                    map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                  *)local_1328,&local_1330);
          *pmVar11 = *pmVar11 + 1.0;
          pSVar9 = SelectionManager::nextSelected(this_00,&local_132c);
        }
        if ((this->flucSliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (this->flucSliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar15 = 0;
          do {
            local_12e8[0] = (double)CONCAT44(local_12e8[0]._4_4_,(int)uVar15);
            pmVar11 = std::
                      map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                    *)local_1328,(key_type *)local_12e8);
            dVar2 = *pmVar11 -
                    (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar15] / (double)this->nProcessed_;
            pdVar6 = (this->flucSliceSDCount_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar6[uVar15] = dVar2 * dVar2 + pdVar6[uVar15];
            uVar15 = (ulong)((int)uVar15 + 1);
          } while (uVar15 < (ulong)((long)(this->flucSliceSDCount_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6
                                   >> 3));
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     *)local_1328);
        iVar14 = iVar14 + (this->super_StaticAnalyser).step_;
      } while (iVar14 < iVar7);
    }
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void PositionZ::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Mat3x3d hmat = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo = int(nBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
        sliceSDCount_[binNo]++;
      }

      // loop over the slices to calculate the charge
    }

    for (int istep = 0; istep < nFrames; istep += step_) {
      std::map<int, RealType> countInBin;

      reader.readFrame(istep);
      currentSnapshot_   = info_->getSnapshotManager()->getCurrentSnapshot();
      Mat3x3d hmat       = currentSnapshot_->getHmat();
      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo = int(nBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
        countInBin[binNo]++;
      }

      // loop over the slices to calculate the charge

      for (unsigned int index = 0; index < flucSliceSDCount_.size(); ++index) {
        RealType flucCount =
            (countInBin[index] - (sliceSDCount_[index] / nProcessed_));
        flucSliceSDCount_[index] += flucCount * flucCount;
      }
    }

    writePositionZ();
  }